

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator=(TPZFMatrix<long> *this,TPZMatrix<long> *A)

{
  undefined1 auVar1 [16];
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  ulong uVar5;
  long *plVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long> *in_RDI;
  int64_t r;
  int64_t c;
  long *dst;
  int64_t size;
  int64_t acols;
  int64_t arows;
  long local_40;
  long local_38;
  long *local_30;
  
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  iVar4 = TPZBaseMatrix::Cols(in_RSI);
  if (in_RDI->fElem != in_RDI->fGiven) {
    if (in_RDI->fElem != (long *)0x0) {
      operator_delete__(in_RDI->fElem);
    }
    in_RDI->fElem = (long *)0x0;
  }
  (in_RDI->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = iVar3;
  (in_RDI->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = iVar4;
  if (in_RDI->fSize < iVar3 * iVar4) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = iVar3 * iVar4;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    plVar6 = (long *)operator_new__(uVar5);
    in_RDI->fElem = plVar6;
  }
  else {
    in_RDI->fElem = in_RDI->fGiven;
  }
  local_30 = in_RDI->fElem;
  for (local_38 = 0; local_38 < (in_RDI->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
      local_38 = local_38 + 1) {
    for (local_40 = 0; local_40 < (in_RDI->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
        local_40 = local_40 + 1) {
      iVar2 = (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RSI,local_40,local_38);
      *local_30 = CONCAT44(extraout_var,iVar2);
      local_30 = local_30 + 1;
    }
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}